

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_mesh * rf_gen_mesh_sphere(rf_mesh *__return_storage_ptr__,float radius,int rings,int slices,
                            rf_allocator allocator,rf_allocator temp_allocator)

{
  int iVar1;
  long lVar2;
  float *pfVar3;
  uint uVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_source_location rVar8;
  rf_allocator_args rVar9;
  undefined1 auVar10 [24];
  undefined1 auVar11 [24];
  undefined1 auVar12 [24];
  uint *puVar13;
  par_shapes_mesh *mesh;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long *in_FS_OFFSET;
  float mintriarea;
  uint uStack_ec;
  uint uStack_bc;
  uint uStack_8c;
  uint uStack_5c;
  rf_allocator allocator_local;
  
  allocator_local.allocator_proc = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  rVar5.proc_name = "rf_gen_mesh_sphere";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x881c;
  rVar9._16_8_ = (ulong)uStack_5c << 0x20;
  rVar9.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar9.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar13 = (uint *)(*allocator_local.allocator_proc)(&allocator_local,rVar5,RF_AM_ALLOC,rVar9);
  __return_storage_ptr__->vbo_id = puVar13;
  puVar13[0] = 0;
  puVar13[1] = 0;
  puVar13[2] = 0;
  puVar13[3] = 0;
  puVar13[3] = 0;
  puVar13[4] = 0;
  puVar13[5] = 0;
  puVar13[6] = 0;
  lVar2 = *in_FS_OFFSET;
  in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
  in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
  uVar19 = 0;
  if (rings < 3 || slices < 3) {
    mesh = (par_shapes_mesh *)0x0;
  }
  else {
    mesh = par_shapes_create_parametric(par_shapes__sphere,slices,rings,(void *)0x0);
    par_shapes_remove_degenerate(mesh,mintriarea);
  }
  par_shapes_scale(mesh,radius,radius,radius);
  rVar6.proc_name = "rf_gen_mesh_sphere";
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.line_in_file = 0x8825;
  auVar10._8_8_ = (ulong)uStack_8c << 0x20;
  auVar10._0_8_ = (long)(mesh->ntriangles * 9) << 2;
  auVar10._16_8_ = 0;
  pfVar14 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar6,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar10 << 0x40));
  __return_storage_ptr__->vertices = pfVar14;
  rVar7.proc_name = "rf_gen_mesh_sphere";
  rVar7.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar7.line_in_file = 0x8826;
  auVar11._8_8_ = (ulong)uStack_bc << 0x20;
  auVar11._0_8_ = (long)(mesh->ntriangles * 6) << 2;
  auVar11._16_8_ = 0;
  pfVar15 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar7,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar11 << 0x40));
  __return_storage_ptr__->texcoords = pfVar15;
  rVar8.proc_name = "rf_gen_mesh_sphere";
  rVar8.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar8.line_in_file = 0x8827;
  auVar12._8_8_ = (ulong)uStack_ec << 0x20;
  auVar12._0_8_ = (long)(mesh->ntriangles * 9) << 2;
  auVar12._16_8_ = 0;
  pfVar16 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar8,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar12 << 0x40));
  __return_storage_ptr__->normals = pfVar16;
  iVar1 = mesh->ntriangles;
  uVar4 = iVar1 * 3;
  __return_storage_ptr__->vertex_count = uVar4;
  __return_storage_ptr__->triangle_count = iVar1;
  uVar17 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar17 = uVar19;
  }
  lVar18 = 2;
  for (; uVar17 != uVar19; uVar19 = uVar19 + 1) {
    pfVar3 = mesh->points;
    uVar20 = (ulong)mesh->triangles[uVar19];
    pfVar14[lVar18 + -2] = pfVar3[uVar20 * 3];
    pfVar14[lVar18 + -1] = pfVar3[uVar20 * 3 + 1];
    pfVar14[lVar18] = pfVar3[uVar20 * 3 + 2];
    pfVar3 = mesh->normals;
    pfVar16[lVar18 + -2] = pfVar3[uVar20 * 3];
    pfVar16[lVar18 + -1] = pfVar3[uVar20 * 3 + 1];
    pfVar16[lVar18] = pfVar3[uVar20 * 3 + 2];
    pfVar3 = mesh->tcoords;
    pfVar15[uVar19 * 2] = pfVar3[uVar20 * 2];
    pfVar15[uVar19 * 2 + 1] = pfVar3[uVar20 * 2 + 1];
    lVar18 = lVar18 + 3;
  }
  par_shapes_free_mesh(mesh);
  *(undefined8 *)(lVar2 + -0x430) = 0;
  *(undefined8 *)(lVar2 + -0x428) = 0;
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_sphere(float radius, int rings, int slices, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        par_shapes_mesh* sphere = par_shapes_create_parametric_sphere(slices, rings);
        par_shapes_scale(sphere, radius, radius, radius);
        // NOTE: Soft normals are computed internally

        mesh.vertices  = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 3 * sizeof(float));
        mesh.texcoords = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 2 * sizeof(float));
        mesh.normals   = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 3 * sizeof(float));

        mesh.vertex_count = sphere->ntriangles * 3;
        mesh.triangle_count = sphere->ntriangles;

        for (rf_int k = 0; k < mesh.vertex_count; k++)
        {
            mesh.vertices[k * 3    ] = sphere->points[sphere->triangles[k] * 3];
            mesh.vertices[k * 3 + 1] = sphere->points[sphere->triangles[k] * 3 + 1];
            mesh.vertices[k * 3 + 2] = sphere->points[sphere->triangles[k] * 3 + 2];

            mesh.normals[k * 3    ] = sphere->normals[sphere->triangles[k] * 3];
            mesh.normals[k * 3 + 1] = sphere->normals[sphere->triangles[k] * 3 + 1];
            mesh.normals[k * 3 + 2] = sphere->normals[sphere->triangles[k] * 3 + 2];

            mesh.texcoords[k * 2    ] = sphere->tcoords[sphere->triangles[k] * 2];
            mesh.texcoords[k * 2 + 1] = sphere->tcoords[sphere->triangles[k] * 2 + 1];
        }

        par_shapes_free_mesh(sphere);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}